

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve
          (SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL> *this,size_t count)

{
  ulong uVar1;
  SPIRCombinedImageSampler **__ptr;
  size_t sVar2;
  ulong uVar3;
  SPIRCombinedImageSampler **ppSVar4;
  size_t i;
  size_t sVar5;
  
  if (count >> 0x3d == 0) {
    uVar1 = this->buffer_capacity;
    if (uVar1 < count) {
      uVar1 = uVar1 + (uVar1 == 0);
      do {
        uVar3 = uVar1;
        uVar1 = uVar3 * 2;
      } while (uVar3 < count);
      ppSVar4 = (SPIRCombinedImageSampler **)malloc(uVar3 * 8);
      if (ppSVar4 == (SPIRCombinedImageSampler **)0x0) goto LAB_001d5d0c;
      __ptr = (this->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).ptr;
      if (ppSVar4 != __ptr) {
        sVar2 = (this->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).buffer_size;
        for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
          ppSVar4[sVar5] = __ptr[sVar5];
        }
      }
      free(__ptr);
      (this->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).ptr = ppSVar4;
      this->buffer_capacity = uVar3;
    }
    return;
  }
LAB_001d5d0c:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}